

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int readMPS_dense_cpp(char *filename,int mxNumRow,int mxNumCol,int *numRow_p,int *numCol_p,
                     int *objSense_p,double *objOffset_p,double **A_rw_p,double **rhs_p,
                     double **cost_p,double **lb_p,double **ub_p,int **integerColumn_p)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  int objSense;
  int numCol;
  int numRow;
  ulong local_f8;
  double objOffset;
  vector<int,_std::allocator<int>_> integerColumn;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> A_rw;
  
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = readMPS_dense(filename,mxNumRow,mxNumCol,&numRow,&numCol,&objSense,&objOffset,&A_rw,&rhs,
                        &cost,&lb,&ub,&integerColumn);
  if (iVar1 == 0) {
    local_f8 = (ulong)numRow;
    *numRow_p = numRow;
    lVar6 = (long)numCol;
    *numCol_p = numCol;
    *objSense_p = objSense;
    *objOffset_p = objOffset;
    uVar7 = 0;
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n",local_f8,(ulong)(uint)numCol);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",SUB84(objOffset,0),
           (ulong)(uint)objSense);
    sVar8 = local_f8 * 8;
    pdVar2 = (double *)malloc(sVar8 * lVar6);
    *A_rw_p = pdVar2;
    pdVar2 = (double *)malloc(sVar8);
    *rhs_p = pdVar2;
    sVar8 = lVar6 * 8;
    pdVar2 = (double *)malloc(sVar8);
    *cost_p = pdVar2;
    pdVar2 = (double *)malloc(sVar8);
    *lb_p = pdVar2;
    pdVar2 = (double *)malloc(sVar8);
    *ub_p = pdVar2;
    piVar3 = (int *)malloc(lVar6 << 2);
    *integerColumn_p = piVar3;
    uVar4 = numCol * (int)local_f8;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      (*A_rw_p)[uVar7] =
           A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar7];
    }
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)local_f8) {
      uVar7 = local_f8 & 0xffffffff;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      (*rhs_p)[uVar5] =
           rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar5];
    }
    iVar1 = 0;
    uVar5 = 0;
    if (0 < numCol) {
      uVar5 = (ulong)(uint)numCol;
    }
    for (lVar6 = 0; uVar5 * 4 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined8 *)((long)*cost_p + lVar6 * 2) =
           *(undefined8 *)
            ((long)cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar6 * 2);
      *(undefined8 *)((long)*lb_p + lVar6 * 2) =
           *(undefined8 *)
            ((long)lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar6 * 2);
      *(undefined8 *)((long)*ub_p + lVar6 * 2) =
           *(undefined8 *)
            ((long)ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar6 * 2);
      *(undefined4 *)((long)piVar3 + lVar6) =
           *(undefined4 *)
            ((long)integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar6);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&integerColumn.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ub.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lb.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cost.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&A_rw.super__Vector_base<double,_std::allocator<double>_>);
  return iVar1;
}

Assistant:

int readMPS_dense_cpp(const char *filename, int mxNumRow, int mxNumCol, 
		      int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		      double ** A_rw_p,
		      double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		      int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  int rtCd = readMPS_dense(filename, mxNumRow, mxNumCol,
			   numRow, numCol, objSense, objOffset,
			   A_rw,
			   rhs, cost, lb, ub,
			   integerColumn);
  if (rtCd) return rtCd;
  (*numRow_p) = numRow;
  (*numCol_p) = numCol;
  (*objSense_p) = objSense;
  (*objOffset_p) = objOffset;
#ifdef JAJH_dev
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  *A_rw_p = (double *) malloc(sizeof(double)*numRow*numCol);
  *rhs_p = (double *) malloc(sizeof(double)*numRow);
  *cost_p = (double *) malloc(sizeof(double)*numCol);
  *lb_p = (double *) malloc(sizeof(double)*numCol);
  *ub_p = (double *) malloc(sizeof(double)*numCol);
  *integerColumn_p = (int *) malloc(sizeof(int)*numCol);
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    (*A_rw_p)[ix_n] = A_rw[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    (*rhs_p)[r_n] = rhs[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    (*cost_p)[c_n] = cost[c_n];
    (*lb_p)[c_n] = lb[c_n];
    (*ub_p)[c_n] = ub[c_n];
    (*integerColumn_p)[c_n] = integerColumn[c_n];
  }
  return 0;
}